

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcBlendEquationAdvancedTests.cpp
# Opt level: O3

Vec4 glcts::SetLum(Vec4 *cbase,Vec4 *clum)

{
  undefined1 auVar1 [16];
  float *in_RDI;
  Vector<float,_4> *res;
  uint uVar2;
  float fVar3;
  float fVar6;
  float fVar7;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  float fVar8;
  float fVar9;
  undefined1 auVar10 [16];
  float fVar11;
  Vec4 VVar12;
  Vec4 VVar13;
  
  VVar12.m_data[3] = clum->m_data[2] * 0.11 + clum->m_data[0] * 0.3 + clum->m_data[1] * 0.59;
  VVar12.m_data[1] = cbase->m_data[2] * 0.11 + cbase->m_data[0] * 0.3 + cbase->m_data[1] * 0.59;
  fVar8 = VVar12.m_data[3] - VVar12.m_data[1];
  fVar3 = cbase->m_data[0] + fVar8;
  fVar6 = cbase->m_data[1] + fVar8;
  fVar7 = cbase->m_data[2] + fVar8;
  fVar8 = cbase->m_data[3] + fVar8;
  VVar12.m_data._8_8_ = CONCAT44(VVar12.m_data[3],VVar12.m_data[3]);
  fVar11 = (float)(~-(uint)(fVar3 <= fVar6) & (uint)fVar6 | -(uint)(fVar3 <= fVar6) & (uint)fVar3);
  uVar2 = -(uint)(fVar11 <= fVar7);
  fVar11 = (float)(~uVar2 & (uint)fVar7 | uVar2 & (uint)fVar11);
  if (0.0 <= fVar11) {
    fVar11 = (float)(~-(uint)(fVar6 <= fVar3) & (uint)fVar6 | -(uint)(fVar6 <= fVar3) & (uint)fVar3)
    ;
    uVar2 = -(uint)(fVar7 <= fVar11);
    fVar9 = (float)(~uVar2 & (uint)fVar7 | uVar2 & (uint)fVar11);
    fVar11 = VVar12.m_data[3];
    if (1.0 < fVar9) {
      fVar11 = 1.0 - VVar12.m_data[3];
      auVar10._0_4_ = fVar11 * (fVar3 - VVar12.m_data[3]);
      auVar10._4_4_ = fVar11 * (fVar6 - VVar12.m_data[3]);
      auVar10._8_4_ = fVar11 * (fVar7 - VVar12.m_data[3]);
      auVar10._12_4_ = fVar11 * (fVar8 - VVar12.m_data[3]);
      auVar5._0_4_ = fVar9 - VVar12.m_data[3];
      auVar5._4_4_ = auVar5._0_4_;
      auVar5._8_4_ = auVar5._0_4_;
      auVar5._12_4_ = auVar5._0_4_;
      auVar5 = divps(auVar10,auVar5);
      *in_RDI = auVar5._0_4_ + VVar12.m_data[3];
      in_RDI[1] = auVar5._4_4_ + VVar12.m_data[3];
      in_RDI[2] = auVar5._8_4_ + VVar12.m_data[3];
      in_RDI[3] = auVar5._12_4_ + VVar12.m_data[3];
      VVar12.m_data._0_8_ = CONCAT44(VVar12.m_data[1],VVar12.m_data[3]);
      return (Vec4)VVar12.m_data;
    }
  }
  else {
    auVar4._0_4_ = (fVar3 - VVar12.m_data[3]) * VVar12.m_data[3];
    auVar4._4_4_ = (fVar6 - VVar12.m_data[3]) * VVar12.m_data[3];
    auVar4._8_4_ = (fVar7 - VVar12.m_data[3]) * VVar12.m_data[3];
    auVar4._12_4_ = (fVar8 - VVar12.m_data[3]) * VVar12.m_data[3];
    VVar12.m_data[1] = VVar12.m_data[3] - fVar11;
    auVar1._4_4_ = VVar12.m_data[1];
    auVar1._0_4_ = VVar12.m_data[1];
    auVar1._8_4_ = VVar12.m_data[1];
    auVar1._12_4_ = VVar12.m_data[1];
    auVar5 = divps(auVar4,auVar1);
    fVar3 = auVar5._0_4_ + VVar12.m_data[3];
    fVar6 = auVar5._4_4_ + VVar12.m_data[3];
    fVar7 = auVar5._8_4_ + VVar12.m_data[3];
    fVar8 = auVar5._12_4_ + VVar12.m_data[3];
    fVar11 = VVar12.m_data[1];
  }
  *in_RDI = fVar3;
  in_RDI[1] = fVar6;
  in_RDI[2] = fVar7;
  in_RDI[3] = fVar8;
  VVar13.m_data[1] = VVar12.m_data[1];
  VVar13.m_data[0] = fVar11;
  VVar13.m_data[2] = VVar12.m_data[3];
  VVar13.m_data[3] = VVar12.m_data[3];
  return (Vec4)VVar13.m_data;
}

Assistant:

static float Luminance(const tcu::Vec4& rgba)
{
	// Coefficients from the KHR_GL_blend_equation_advanced test spec.
	return 0.30f * rgba[0] + 0.59f * rgba[1] + 0.11f * rgba[2];
}